

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::unset_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration)

{
  TypedID<(spirv_cross::Types)0> local_24;
  mapped_type *local_20;
  Decoration *dec;
  ExtendedDecorations decoration_local;
  uint32_t id_local;
  Compiler *this_local;
  
  dec._0_4_ = decoration;
  dec._4_4_ = id;
  _decoration_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_24,id);
  local_20 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->ir).meta,&local_24);
  Bitset::clear(&(local_20->decoration).extended.flags,(ExtendedDecorations)dec);
  (local_20->decoration).extended.values[(ExtendedDecorations)dec] = 0;
  return;
}

Assistant:

void Compiler::unset_extended_decoration(uint32_t id, ExtendedDecorations decoration)
{
	auto &dec = ir.meta[id].decoration;
	dec.extended.flags.clear(decoration);
	dec.extended.values[decoration] = 0;
}